

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O1

void __thiscall Entity::Hit(Entity *this,int points)

{
  int iVar1;
  ostream *this_00;
  long *plVar2;
  
  iVar1 = this->durability - points;
  if (iVar1 < 0xb) {
    iVar1 = 10;
  }
  this->durability = iVar1;
  this_00 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                       (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"Weapon Durability",0x11);
  plVar2 = (long *)std::ostream::operator<<(this_00,this->durability);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Entity::Hit(int points) {
  durability = std::max(10, durability - points);
  std::cout << name << "Weapon Durability" << durability << std::endl;
}